

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_avx2.c
# Opt level: O0

double aom_compute_correlation_avx2
                 (uchar *frame1,int stride1,int x1,int y1,double mean1,double one_over_stddev1,
                 uchar *frame2,int stride2,int x2,int y2,double mean2,double one_over_stddev2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  int in_stack_00000008;
  double covariance;
  int cross;
  __m128i tmp;
  __m256i v2;
  __m256i v1;
  int i;
  __m256i cross_vec;
  int local_230;
  int iStack_22c;
  int iStack_228;
  int iStack_224;
  int local_1c4;
  undefined1 local_1c0 [32];
  undefined1 (*local_170) [16];
  undefined1 (*local_148) [16];
  undefined1 local_50 [16];
  
  local_1c0 = ZEXT1632(ZEXT816(0));
  local_148 = (undefined1 (*) [16])(in_RDI + ((in_ECX + -7) * in_ESI + in_EDX + -7));
  local_170 = (undefined1 (*) [16])(in_R8 + ((x2 + -7) * in_R9D + in_stack_00000008 + -7));
  for (local_1c4 = 0; local_1c4 < 0x10; local_1c4 = local_1c4 + 1) {
    auVar2 = vpmovzxbw_avx2(*local_148);
    auVar3 = vpmovzxbw_avx2(*local_170);
    auVar2 = vpmaddwd_avx2(auVar2,auVar3);
    local_1c0 = vpaddd_avx2(local_1c0,auVar2);
    local_148 = (undefined1 (*) [16])(*local_148 + in_ESI);
    local_170 = (undefined1 (*) [16])(*local_170 + in_R9D);
  }
  auVar1 = vpaddd_avx(local_1c0._16_16_,local_50);
  iStack_224 = auVar1._12_4_;
  iStack_228 = auVar1._8_4_;
  local_230 = auVar1._0_4_;
  iStack_22c = auVar1._4_4_;
  return (-in_XMM0_Qa * in_XMM2_Qa + (double)(local_230 + iStack_22c + iStack_228 + iStack_224)) *
         in_XMM1_Qa * in_XMM3_Qa;
}

Assistant:

double aom_compute_correlation_avx2(const unsigned char *frame1, int stride1,
                                    int x1, int y1, double mean1,
                                    double one_over_stddev1,
                                    const unsigned char *frame2, int stride2,
                                    int x2, int y2, double mean2,
                                    double one_over_stddev2) {
  __m256i cross_vec = _mm256_setzero_si256();

  frame1 += (y1 - MATCH_SZ_BY2) * stride1 + (x1 - MATCH_SZ_BY2);
  frame2 += (y2 - MATCH_SZ_BY2) * stride2 + (x2 - MATCH_SZ_BY2);

  for (int i = 0; i < MATCH_SZ; ++i) {
    const __m256i v1 = _mm256_cvtepu8_epi16(_mm_loadu_si128((__m128i *)frame1));
    const __m256i v2 = _mm256_cvtepu8_epi16(_mm_loadu_si128((__m128i *)frame2));

    cross_vec = _mm256_add_epi32(cross_vec, _mm256_madd_epi16(v1, v2));

    frame1 += stride1;
    frame2 += stride2;
  }

  // Sum cross_vec into a single value
  const __m128i tmp = _mm_add_epi32(_mm256_extracti128_si256(cross_vec, 0),
                                    _mm256_extracti128_si256(cross_vec, 1));
  const int cross = _mm_extract_epi32(tmp, 0) + _mm_extract_epi32(tmp, 1) +
                    _mm_extract_epi32(tmp, 2) + _mm_extract_epi32(tmp, 3);

  // Note: In theory, the calculations here "should" be
  //   covariance = cross / N^2 - mean1 * mean2
  //   correlation = covariance / (stddev1 * stddev2).
  //
  // However, because of the scaling in aom_compute_mean_stddev, the
  // lines below actually calculate
  //   covariance * N^2 = cross - (mean1 * N) * (mean2 * N)
  //   correlation = (covariance * N^2) / ((stddev1 * N) * (stddev2 * N))
  //
  // ie. we have removed the need for a division, and still end up with the
  // correct unscaled correlation (ie, in the range [-1, +1])
  const double covariance = cross - mean1 * mean2;
  const double correlation = covariance * (one_over_stddev1 * one_over_stddev2);
  return correlation;
}